

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall minja::CommentTemplateToken::~CommentTemplateToken(CommentTemplateToken *this)

{
  CommentTemplateToken *in_RDI;
  
  ~CommentTemplateToken(in_RDI);
  operator_delete(in_RDI,0x50);
  return;
}

Assistant:

CommentTemplateToken(const Location & loc, SpaceHandling pre, SpaceHandling post, const std::string& t) : TemplateToken(Type::Comment, loc, pre, post), text(t) {}